

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PBool::PBool(PBool *this)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  long *plVar3;
  long *plVar4;
  PClass *pPVar5;
  bool bVar6;
  
  PInt::PInt(&this->super_PInt,1,true);
  *(undefined ***)&this->super_PInt = &PTR_StaticType_0086d6e8;
  pPVar2 = PSymbolConstNumeric::RegistrationInfo.MyClass;
  plVar3 = (long *)((ulong)((*(int *)&(this->super_PInt).field_0x50 - 1U & 0x23b) * 0x18) +
                   *(long *)&(this->super_PInt).field_0x40);
  do {
    plVar4 = plVar3;
    if ((plVar4 == (long *)0x0) || ((long *)*plVar4 == (long *)0x1)) goto LAB_004cbce9;
    plVar3 = (long *)*plVar4;
  } while ((int)plVar4[1] != 0x23b);
  puVar1 = (undefined8 *)plVar4[2];
  if (puVar1 != (undefined8 *)0x0) {
    pPVar5 = (PClass *)puVar1[1];
    if (pPVar5 == (PClass *)0x0) {
      pPVar5 = (PClass *)(**(code **)*puVar1)(puVar1);
      puVar1[1] = pPVar5;
    }
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (bVar6) {
      *(undefined4 *)(puVar1 + 6) = 1;
      return;
    }
  }
LAB_004cbce9:
  __assert_fail("maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric))",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x46a,"PBool::PBool()");
}

Assistant:

PBool::PBool()
: PInt(sizeof(bool), true)
{
	// Override the default max set by PInt's constructor
	PSymbolConstNumeric *maxsym = static_cast<PSymbolConstNumeric *>(Symbols.FindSymbol(NAME_Max, false));
	assert(maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric)));
	maxsym->Value = 1;
}